

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

Nullable<CordRep_*>
absl::lts_20240722::NewTree(Nullable<const_char_*> data,size_t length,size_t alloc_hint)

{
  Nullable<CordRep_*> pCVar1;
  CordRep *rep;
  CordRepBtree *pCVar2;
  
  if (length == 0) {
    pCVar1 = (Nullable<CordRep_*>)0x0;
  }
  else {
    if (0xff3 < length) {
      rep = &cord_internal::CordRepFlat::NewImpl<4096ul>(0xff3)->super_CordRep;
      rep->length = 0xff3;
      memcpy(rep->storage,data,0xff3);
      pCVar2 = cord_internal::CordRepBtree::Create(rep);
      pCVar1 = (Nullable<CordRep_*>)
               absl::lts_20240722::cord_internal::CordRepBtree::Append
                         (pCVar2,length - 0xff3,data + 0xff3,0);
      return pCVar1;
    }
    pCVar1 = &cord_internal::CordRepFlat::NewImpl<4096ul>(length)->super_CordRep;
    ((CordRep *)&pCVar1->length)->length = length;
    memcpy(pCVar1->storage,data,length);
  }
  return pCVar1;
}

Assistant:

static absl::Nullable<CordRep*> NewTree(absl::Nullable<const char*> data,
                                        size_t length, size_t alloc_hint) {
  if (length == 0) return nullptr;
  return NewBtree(data, length, alloc_hint);
}